

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O1

bool __thiscall ON_MorphControl::Transform(ON_MorphControl *this,ON_Xform *xform)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = ON_Geometry::Transform(&this->super_ON_Geometry,xform);
  if (bVar2) {
    iVar1 = this->m_varient;
    if (iVar1 == 3) {
      bVar2 = ON_NurbsCage::Transform(&this->m_nurbs_cage,xform);
      return bVar2;
    }
    if (iVar1 == 2) {
      bVar2 = ON_NurbsSurface::Transform(&this->m_nurbs_surface,xform);
      return bVar2;
    }
    if (iVar1 == 1) {
      bVar2 = ON_NurbsCurve::Transform(&this->m_nurbs_curve,xform);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool ON_MorphControl::Transform( 
        const ON_Xform& xform
        )
{
  // Call the base class so any user data is transformed.
  if (!this->ON_Geometry::Transform(xform))
    return false;

  bool rc = false;
  switch(m_varient)
  {
  case 1:
    rc = m_nurbs_curve.Transform(xform);
    break;

  case 2:
    rc = m_nurbs_surface.Transform(xform);
    break;

  case 3:
    rc = m_nurbs_cage.Transform(xform);
    break;
  }
  return rc;
}